

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  LayerUnion LVar4;
  long *plVar5;
  size_type *psVar6;
  Result *_result;
  string err;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (layer->_oneof_case_[0] == 0x3e3) {
            LVar4 = layer->layer_;
          }
          else {
            LVar4.slicestatic_ = Specification::SliceStaticLayerParams::default_instance();
          }
          if (((LVar4.convolution_)->kernelsize_).current_size_ == 0) {
            std::operator+(&local_40,"Begin IDs are required parameters for \'",(layer->name_).ptr_)
            ;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60.field_2._8_8_ = plVar5[3];
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
          }
          else if (((LVar4.convolution_)->dilationfactor_).current_size_ == 0) {
            std::operator+(&local_40,"End IDs are required parameters for \'",(layer->name_).ptr_);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60.field_2._8_8_ = plVar5[3];
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
          }
          else if (((RepeatedField<long> *)&(LVar4.bidirectionallstm_)->_cached_size_)->
                   current_size_ == 0) {
            std::operator+(&local_40,"Strides are required parameters for \'",(layer->name_).ptr_);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60.field_2._8_8_ = plVar5[3];
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
          }
          else if (((LVar4.convolution_)->stride_).current_size_ == 0) {
            std::operator+(&local_40,"Begin masks are required parameters for \'",
                           (layer->name_).ptr_);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60.field_2._8_8_ = plVar5[3];
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
          }
          else {
            if (((LVar4.convolution_)->outputshape_).current_size_ != 0) {
              Result::Result(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            std::operator+(&local_40,"End masks are required parameters for \'",(layer->name_).ptr_)
            ;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60.field_2._8_8_ = plVar5[3];
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar6;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.slicestatic();
    // check for required parameters
    if (params.beginids_size() == 0) {
        const std::string err = "Begin IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endids_size() == 0) {
        const std::string err = "End IDs are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.strides_size() == 0) {
        const std::string err = "Strides are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.beginmasks_size() == 0) {
        const std::string err = "Begin masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.endmasks_size() == 0) {
        const std::string err = "End masks are required parameters for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}